

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

void __thiscall RandomBotStrategy::RandomBotStrategy(RandomBotStrategy *this)

{
  int *piVar1;
  string *this_00;
  allocator<char> local_19;
  
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0013a968;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  (this->super_PlayerStrategy).armiesToPlace = piVar1;
  (this->super_PlayerStrategy).player = (Player *)0x0;
  (this->super_PlayerStrategy).from = (Country *)0x0;
  (this->super_PlayerStrategy).to = (Country *)0x0;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"RANDOM",&local_19);
  (this->super_PlayerStrategy).strategyName = this_00;
  return;
}

Assistant:

RandomBotStrategy::RandomBotStrategy() {
    this->armiesToPlace = new int(0);
    this->player = nullptr;
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string("RANDOM");
}